

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeapBlockMap.cpp
# Opt level: O1

void __thiscall Memory::HeapBlockMap32::ResetMarks(HeapBlockMap32 *this)

{
  L2MapChunk *__s;
  uint i;
  long lVar1;
  
  lVar1 = 0;
  do {
    __s = this->map[lVar1];
    if (__s != (L2MapChunk *)0x0) {
      memset(__s,0,0x2000);
      __s->isNewChunk = false;
      memset(__s->pageMarkCount,0,0x200);
    }
    lVar1 = lVar1 + 1;
  } while (lVar1 != 0x1000);
  return;
}

Assistant:

void
HeapBlockMap32::ResetMarks()
{
    for (uint i = 0; i < L1Count; i++)
    {
        L2MapChunk * chunk = map[i];
        if (chunk == nullptr)
        {
            continue;
        }

        chunk->markBits.ClearAll();

#ifdef RECYCLER_VERIFY_MARK
        chunk->isNewChunk = false;
#endif

#if DBG
        for (uint j = 0; j < L2Count; j++)
        {
            chunk->pageMarkCount[j] = 0;
        }
#endif
    }
}